

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::updateSampler(RemotelyControlledSampler *this)

{
  bool bVar1;
  element_type *peVar2;
  Counter *pCVar3;
  exception *ex_1;
  lock_guard<std::mutex> lock;
  exception *ex;
  undefined1 local_88 [8];
  SamplingStrategyResponse response;
  RemotelyControlledSampler *this_local;
  
  response._112_8_ = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_manager);
  if (!bVar1) {
    __assert_fail("_manager",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/samplers/RemotelyControlledSampler.cpp"
                  ,0x91,"void jaegertracing::samplers::RemotelyControlledSampler::updateSampler()");
  }
  sampling_manager::thrift::SamplingStrategyResponse::SamplingStrategyResponse
            ((SamplingStrategyResponse *)local_88);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->_manager);
  if (!bVar1) {
    __assert_fail("_manager",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/samplers/RemotelyControlledSampler.cpp"
                  ,0x94,"void jaegertracing::samplers::RemotelyControlledSampler::updateSampler()");
  }
  peVar2 = std::
           __shared_ptr_access<jaegertracing::sampling_manager::thrift::SamplingManagerIf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::sampling_manager::thrift::SamplingManagerIf,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_manager);
  (*peVar2->_vptr_SamplingManagerIf[2])(peVar2,local_88,&this->_serviceName);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&ex_1,&this->_mutex);
  pCVar3 = metrics::Metrics::samplerRetrieved(this->_metrics);
  (*pCVar3->_vptr_Counter[2])(pCVar3,1);
  if (((byte)response.operationSampling.__isset >> 2 & 1) == 0) {
    updateRateLimitingOrProbabilisticSampler(this,(SamplingStrategyResponse *)local_88);
  }
  else {
    updateAdaptiveSampler
              (this,(PerOperationSamplingStrategies *)
                    &response.rateLimitingSampling.maxTracesPerSecond);
  }
  pCVar3 = metrics::Metrics::samplerUpdated(this->_metrics);
  (*pCVar3->_vptr_Counter[2])(pCVar3,1);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ex_1);
  sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
            ((SamplingStrategyResponse *)local_88);
  return;
}

Assistant:

void RemotelyControlledSampler::updateSampler()
{
    assert(_manager);
    sampling_manager::thrift::SamplingStrategyResponse response;
    try {
        assert(_manager);
        _manager->getSamplingStrategy(response, _serviceName);
    } catch (const std::exception& ex) {
        _metrics.samplerQueryFailure().inc(1);
        return;
    } catch (...) {
        _metrics.samplerQueryFailure().inc(1);
        return;
    }

    std::lock_guard<std::mutex> lock(_mutex);
    _metrics.samplerRetrieved().inc(1);

    if (response.__isset.operationSampling) {
        updateAdaptiveSampler(response.operationSampling);
    }
    else {
        try {
            updateRateLimitingOrProbabilisticSampler(response);
        } catch (const std::exception& ex) {
            _metrics.samplerUpdateFailure().inc(1);
            return;
        } catch (...) {
            _metrics.samplerUpdateFailure().inc(1);
            return;
        }
    }
    _metrics.samplerUpdated().inc(1);
}